

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

auto_ptr<avro::OutputStream> avro::fileOutputStream(char *filename,size_t bufferSize)

{
  element_type *__p;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *this;
  auto_ptr<avro::OutputStream> *in_RDI;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> out;
  char *in_stack_000000b8;
  FileBufferCopyOut *in_stack_000000c0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar1;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> in_stack_ffffffffffffffc8;
  BufferCopyOutputStream *in_stack_ffffffffffffffd0;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> local_20 [4];
  
  __p = (element_type *)operator_new(0x10);
  anon_unknown_3::FileBufferCopyOut::FileBufferCopyOut(in_stack_000000c0,in_stack_000000b8);
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyOut>::auto_ptr(local_20,__p);
  this = (auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *)operator_new(0x38);
  uVar1 = 1;
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyOut>::auto_ptr
            (this,(auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *)&stack0xffffffffffffffc8);
  BufferCopyOutputStream::BufferCopyOutputStream
            (in_stack_ffffffffffffffd0,
             (auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *)
             in_stack_ffffffffffffffc8._M_ptr,CONCAT17(uVar1,in_stack_ffffffffffffffc0));
  std::auto_ptr<avro::OutputStream>::auto_ptr(in_RDI,(element_type *)this);
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyOut>::~auto_ptr(this);
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyOut>::~auto_ptr(this);
  return (auto_ptr<avro::OutputStream>)(OutputStream *)in_RDI;
}

Assistant:

auto_ptr<OutputStream> fileOutputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyOut> out(new FileBufferCopyOut(filename));
    return auto_ptr<OutputStream>(new BufferCopyOutputStream(out, bufferSize));
}